

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

bool Assimp::Blender::readCustomData
               (shared_ptr<Assimp::Blender::ElemBase> *out,int cdtype,size_t cnt,FileDatabase *db)

{
  code *UNRECOVERED_JUMPTABLE;
  _func_void_ElemBase_ptr *__d;
  undefined1 uVar1;
  ElemBase *__p;
  Error *this;
  long lVar2;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  if (0x29 < (uint)cdtype) {
    this = (Error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::operator<<((ostream *)local_1a8,"CustomData.type ");
    ::std::ostream::operator<<(local_1a8,cdtype);
    ::std::operator<<((ostream *)local_1a8," out of index");
    ::std::__cxx11::stringbuf::str();
    Error::Error(this,&sStack_1c8);
    __cxa_throw(this,&Error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (cnt != 0) {
    lVar2 = (ulong)(uint)cdtype * 0x18;
    UNRECOVERED_JUMPTABLE = *(code **)(customDataTypeDescriptions + lVar2);
    if (((UNRECOVERED_JUMPTABLE != (code *)0x0) &&
        (*(code **)(customDataTypeDescriptions + lVar2 + 8) != (code *)0x0)) &&
       (__d = *(_func_void_ElemBase_ptr **)(customDataTypeDescriptions + lVar2 + 0x10),
       __d != (_func_void_ElemBase_ptr *)0x0)) {
      __p = (ElemBase *)(**(code **)(customDataTypeDescriptions + lVar2 + 8))(cnt);
      ::std::__shared_ptr<Assimp::Blender::ElemBase,(__gnu_cxx::_Lock_policy)2>::
      reset<Assimp::Blender::ElemBase,void(*)(Assimp::Blender::ElemBase*)>
                ((__shared_ptr<Assimp::Blender::ElemBase,(__gnu_cxx::_Lock_policy)2> *)out,__p,__d);
      uVar1 = (*UNRECOVERED_JUMPTABLE)
                        ((out->
                         super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,cnt,db);
      return (bool)uVar1;
    }
  }
  return false;
}

Assistant:

bool readCustomData(std::shared_ptr<ElemBase> &out, const int cdtype, const size_t cnt, const FileDatabase &db) {
            if (!isValidCustomDataType(cdtype)) {
                throw Error((Formatter::format(), "CustomData.type ", cdtype, " out of index"));
            }

            const CustomDataTypeDescription cdtd = customDataTypeDescriptions[cdtype];
            if (cdtd.Read && cdtd.Create && cdtd.Destroy && cnt > 0) {
                // allocate cnt elements and parse them from file
                out.reset(cdtd.Create(cnt), cdtd.Destroy);
                return cdtd.Read(out.get(), cnt, db);
            }
            return false;
        }